

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  uint16_t uVar6;
  uint16_t uVar7;
  container_t *pcVar8;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  uint64_t answer;
  int length2;
  int length1;
  int32_t in_stack_ffffffffffffffa8;
  uint16_t in_stack_ffffffffffffffae;
  undefined7 in_stack_ffffffffffffffb0;
  uint8_t type2_00;
  undefined4 in_stack_ffffffffffffffc8;
  int local_30;
  int local_2c;
  uint8_t type1_00;
  
  iVar1 = in_RDI->size;
  iVar2 = in_RSI->size;
  local_2c = 0;
  local_30 = 0;
  while( true ) {
    while( true ) {
      bVar4 = local_2c < iVar1;
      bVar3 = local_30 < iVar2;
      type2_00 = bVar4 && bVar3;
      if (!bVar4 || !bVar3) {
        return false;
      }
      uVar6 = ra_get_key_at_index(in_RDI,(uint16_t)local_2c);
      uVar7 = ra_get_key_at_index(in_RSI,(uint16_t)local_30);
      if (uVar6 == uVar7) break;
      if (uVar6 < uVar7) {
        local_2c = ra_advance_until((roaring_array_t *)CONCAT17(type2_00,in_stack_ffffffffffffffb0),
                                    in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8);
      }
      else {
        local_30 = ra_advance_until((roaring_array_t *)CONCAT17(type2_00,in_stack_ffffffffffffffb0),
                                    in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8);
      }
    }
    pcVar8 = ra_get_container_at_index(in_RDI,(uint16_t)local_2c,&stack0xffffffffffffffcb);
    type1_00 = (uint8_t)((ulong)pcVar8 >> 0x38);
    pcVar8 = ra_get_container_at_index(in_RSI,(uint16_t)local_30,&stack0xffffffffffffffca);
    _Var5 = container_intersect((container_t *)
                                CONCAT26(uVar6,CONCAT24(uVar7,in_stack_ffffffffffffffc8)),type1_00,
                                pcVar8,type2_00);
    if (_Var5) break;
    local_2c = local_2c + 1;
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                              const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            if (container_intersect(c1, type1, c2, type2)) return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}